

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall
lunasvg::Canvas::blendCanvas(Canvas *this,Canvas *canvas,BlendMode blendMode,float opacity)

{
  plutovg_canvas_t *canvas_00;
  int iVar1;
  plutovg_surface_t *surface;
  undefined1 local_38 [8];
  plutovg_matrix_t matrix;
  float opacity_local;
  BlendMode blendMode_local;
  Canvas *canvas_local;
  Canvas *this_local;
  
  local_38._0_4_ = 1.0;
  local_38._4_4_ = 0.0;
  matrix.a = 0.0;
  matrix.b = 1.0;
  matrix.e = opacity;
  matrix.f = (float)blendMode;
  iVar1 = x(canvas);
  matrix.c = (float)iVar1;
  iVar1 = y(canvas);
  matrix.d = (float)iVar1;
  plutovg_canvas_reset_matrix(this->m_canvas);
  plutovg_canvas_translate(this->m_canvas,(float)-this->m_x,(float)-this->m_y);
  plutovg_canvas_set_operator(this->m_canvas,(plutovg_operator_t)matrix.f);
  canvas_00 = this->m_canvas;
  surface = Canvas::surface(canvas);
  plutovg_canvas_set_texture
            (canvas_00,surface,PLUTOVG_TEXTURE_TYPE_PLAIN,matrix.e,(plutovg_matrix_t *)local_38);
  plutovg_canvas_paint(this->m_canvas);
  return;
}

Assistant:

void Canvas::blendCanvas(const Canvas& canvas, BlendMode blendMode, float opacity)
{
    plutovg_matrix_t matrix = { 1, 0, 0, 1, static_cast<float>(canvas.x()), static_cast<float>(canvas.y()) };
    plutovg_canvas_reset_matrix(m_canvas);
    plutovg_canvas_translate(m_canvas, -m_x, -m_y);
    plutovg_canvas_set_operator(m_canvas, static_cast<plutovg_operator_t>(blendMode));
    plutovg_canvas_set_texture(m_canvas, canvas.surface(), PLUTOVG_TEXTURE_TYPE_PLAIN, opacity, &matrix);
    plutovg_canvas_paint(m_canvas);
}